

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O3

void asm_fxstore(ASMState *as,IRIns *ir)

{
  char cVar1;
  MCode *pMVar2;
  IRIns *pIVar3;
  byte bVar4;
  uint uVar5;
  long lVar6;
  RegSet RVar7;
  uint rr;
  x86Op xo;
  int32_t iVar8;
  IRIns IVar9;
  
  if ((ir->field_1).r == 0xfe) {
    return;
  }
  uVar5 = (ir->field_1).t.irt & 0x1f;
  if (((uVar5 < 0x13) && ((0x66000U >> uVar5 & 1) != 0)) ||
     (lVar6 = (long)(short)(ir->field_0).op2, lVar6 < 0)) {
LAB_00144dc0:
    cVar1 = *(char *)((long)as->ir + (ulong)(ir->field_0).op2 * 8 + 6);
    rr = (uint)cVar1;
    if (cVar1 < '\0') {
      RVar7 = 0xbfef;
      if ((byte)((char)uVar5 - 0xdU) < 2) {
        RVar7 = 0xffff0000;
      }
      rr = ra_allocref(as,(uint)(ir->field_0).op2,RVar7);
    }
    bVar4 = (byte)rr & 0x1f;
    as->weakset = as->weakset & (-2 << bVar4 | 0xfffffffeU >> 0x20 - bVar4);
    RVar7 = ~(1 << (rr & 0x1f)) & 0xbfef;
    iVar8 = 0;
  }
  else {
    pIVar3 = as->ir;
    if ((*(char *)((long)pIVar3 + lVar6 * 8 + 5) == '\x1b') ||
       ((0x605fd9U >> (*(uint *)((long)pIVar3 + lVar6 * 8 + 4) & 0x1f) & 1) == 0)) {
      IVar9.gcr.gcptr64._4_4_ = 0;
      IVar9.field_1.op12 = pIVar3[lVar6].field_1.op12;
    }
    else {
      IVar9 = pIVar3[lVar6 + 1];
      if ((IRIns)(long)IVar9.i != IVar9) goto LAB_00144dc0;
    }
    iVar8 = IVar9.i;
    RVar7 = 0xbfef;
    rr = 0x80;
  }
  if ((ir->field_1).o == 'M') {
    asm_fusefref(as,as->ir + (ir->field_0).op1,RVar7);
  }
  else {
    asm_fusexref(as,(uint)(ir->field_0).op1,RVar7);
  }
  uVar5 = (ir->field_1).t.irt & 0x1f;
  if (rr < 0x80) {
    switch(uVar5) {
    case 0xd:
      xo = XO_MOVSSto;
      break;
    case 0xe:
      xo = XO_MOVSDto;
      break;
    case 0xf:
    case 0x10:
      rr = rr | 0x200;
      xo = XO_MOVtob;
      break;
    case 0x11:
    case 0x12:
      xo = XO_MOVtow;
      break;
    default:
      if ((0x605fd9U >> uVar5 & 1) != 0) {
        rr = rr | 0x80200;
      }
      xo = XO_MOVto;
    }
  }
  else if ((byte)((char)uVar5 - 0xfU) < 2) {
    pMVar2 = as->mcp;
    as->mcp = pMVar2 + -1;
    pMVar2[-1] = (MCode)iVar8;
    xo = XO_MOVmib;
    rr = 0;
  }
  else {
    pMVar2 = as->mcp;
    *(int32_t *)(pMVar2 + -4) = iVar8;
    as->mcp = pMVar2 + -4;
    uVar5._0_2_ = *(IROpT *)((long)ir + 4);
    uVar5._2_2_ = *(IRRef1 *)((long)ir + 6);
    rr = -(uint)((0x605fd9U >> (uVar5 & 0x1f) & 1) != 0) & 0x80200;
    xo = XO_MOVmi;
  }
  emit_mrm(as,xo,rr,0x20);
  return;
}

Assistant:

static void asm_fxstore(ASMState *as, IRIns *ir)
{
  RegSet allow = RSET_GPR;
  Reg src = RID_NONE, osrc = RID_NONE;
  int32_t k = 0;
  if (ir->r == RID_SINK)
    return;
  /* The IRT_I16/IRT_U16 stores should never be simplified for constant
  ** values since mov word [mem], imm16 has a length-changing prefix.
  */
  if (irt_isi16(ir->t) || irt_isu16(ir->t) || irt_isfp(ir->t) ||
      !asm_isk32(as, ir->op2, &k)) {
    RegSet allow8 = irt_isfp(ir->t) ? RSET_FPR :
		    (irt_isi8(ir->t) || irt_isu8(ir->t)) ? RSET_GPR8 : RSET_GPR;
    src = osrc = ra_alloc1(as, ir->op2, allow8);
    if (!LJ_64 && !rset_test(allow8, src)) {  /* Already in wrong register. */
      rset_clear(allow, osrc);
      src = ra_scratch(as, allow8);
    }
    rset_clear(allow, src);
  }
  if (ir->o == IR_FSTORE) {
    asm_fusefref(as, IR(ir->op1), allow);
  } else {
    asm_fusexref(as, ir->op1, allow);
    if (LJ_32 && ir->o == IR_HIOP) as->mrm.ofs += 4;
  }
  if (ra_hasreg(src)) {
    x86Op xo;
    switch (irt_type(ir->t)) {
    case IRT_I8: case IRT_U8: xo = XO_MOVtob; src |= FORCE_REX; break;
    case IRT_I16: case IRT_U16: xo = XO_MOVtow; break;
    case IRT_NUM: xo = XO_MOVSDto; break;
    case IRT_FLOAT: xo = XO_MOVSSto; break;
#if LJ_64 && !LJ_GC64
    case IRT_LIGHTUD:
      /* NYI: mask 64 bit lightuserdata. */
      lj_assertA(0, "store of lightuserdata");
#endif
    default:
      if (LJ_64 && irt_is64(ir->t))
	src |= REX_64;
      else
	lj_assertA(irt_isint(ir->t) || irt_isu32(ir->t) || irt_isaddr(ir->t),
		   "unsplit 64 bit store");
      xo = XO_MOVto;
      break;
    }
    emit_mrm(as, xo, src, RID_MRM);
    if (!LJ_64 && src != osrc) {
      ra_noweak(as, osrc);
      emit_rr(as, XO_MOV, src, osrc);
    }
  } else {
    if (irt_isi8(ir->t) || irt_isu8(ir->t)) {
      emit_i8(as, k);
      emit_mrm(as, XO_MOVmib, 0, RID_MRM);
    } else {
      lj_assertA(irt_is64(ir->t) || irt_isint(ir->t) || irt_isu32(ir->t) ||
		 irt_isaddr(ir->t), "bad store type");
      emit_i32(as, k);
      emit_mrm(as, XO_MOVmi, REX_64IR(ir, 0), RID_MRM);
    }
  }
}